

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O2

U32 __thiscall
LASquadtree::get_level_index(LASquadtree *this,F64 x,F64 y,U32 level,F32 *min,F32 *max)

{
  int iVar1;
  U32 UVar2;
  bool bVar3;
  F32 FVar4;
  F32 FVar5;
  float fVar6;
  F32 FVar7;
  F32 FVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float cell_mid_y;
  float cell_mid_x;
  
  FVar4 = this->max_x;
  FVar8 = this->min_y;
  FVar5 = this->max_y;
  FVar7 = this->min_x;
  UVar2 = 0;
  while (bVar3 = level != 0, level = level - 1, bVar3) {
    fVar9 = ((float)FVar7 + (float)FVar4) * 0.5;
    fVar10 = ((float)FVar8 + (float)FVar5) * 0.5;
    dVar11 = (double)fVar9;
    if ((double)x < dVar11) {
      FVar4 = (F32)fVar9;
      fVar9 = (float)FVar7;
    }
    fVar6 = fVar10;
    if ((double)fVar10 <= (double)y) {
      fVar6 = (float)FVar5;
      FVar8 = (F32)fVar10;
    }
    iVar1 = UVar2 * 4;
    FVar5 = (F32)fVar6;
    FVar7 = (F32)fVar9;
    UVar2 = (dVar11 <= (double)x) + 2 + UVar2 * 4;
    if ((double)y < (double)fVar10) {
      UVar2 = (uint)(dVar11 <= (double)x) + iVar1;
    }
  }
  if (min != (F32 *)0x0) {
    *min = FVar7;
    min[1] = FVar8;
  }
  if (max != (F32 *)0x0) {
    *max = FVar4;
    max[1] = FVar5;
  }
  return UVar2;
}

Assistant:

U32 LASquadtree::get_level_index(const F64 x, const F64 y, U32 level, F32* min, F32* max) const
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  float cell_min_x, cell_max_x;
  float cell_min_y, cell_max_y;
  
  cell_min_x = min_x;
  cell_max_x = max_x;
  cell_min_y = min_y;
  cell_max_y = max_y;

  U32 level_index = 0;

  while (level)
  {
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (x < cell_mid_x)
    {
      cell_max_x = cell_mid_x;
    }
    else
    {
      cell_min_x = cell_mid_x;
      level_index |= 1;
    }
    if (y < cell_mid_y)
    {
      cell_max_y = cell_mid_y;
    }
    else
    {
      cell_min_y = cell_mid_y;
      level_index |= 2;
    }
    level--;
  }
  if (min)
  {
    min[0] = cell_min_x;
    min[1] = cell_min_y;
  }
  if (max)
  {
    max[0] = cell_max_x;
    max[1] = cell_max_y;
  }
  return level_index;
}